

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Set_Renderer(FT_Library library,FT_Renderer_conflict renderer,FT_UInt num_params,
                        FT_Parameter *parameters)

{
  FT_ListNode pFVar1;
  FT_ListNode pFVar2;
  FT_ListNode pFVar3;
  FT_Renderer_SetModeFunc p_Var4;
  FT_Error FVar5;
  FT_ListNode pFVar6;
  FT_ListNode pFVar7;
  
  if (library == (FT_Library)0x0) {
    FVar5 = 0x21;
  }
  else {
    FVar5 = 6;
    if ((renderer != (FT_Renderer_conflict)0x0) &&
       (num_params == 0 || parameters != (FT_Parameter *)0x0)) {
      pFVar1 = (library->renderers).head;
      for (pFVar6 = pFVar1; pFVar6 != (FT_ListNode)0x0; pFVar6 = pFVar6->next) {
        if ((FT_Renderer_conflict)pFVar6->data == renderer) goto LAB_00219626;
      }
      pFVar6 = (FT_ListNode)0x0;
LAB_00219626:
      if (pFVar6 != (FT_ListNode)0x0) {
        pFVar2 = pFVar6->prev;
        if (pFVar2 != (FT_ListNode)0x0) {
          pFVar3 = pFVar6->next;
          pFVar2->next = pFVar3;
          pFVar7 = (FT_ListNode)&(library->renderers).tail;
          if (pFVar3 != (FT_ListNode)0x0) {
            pFVar7 = pFVar3;
          }
          pFVar7->prev = pFVar2;
          pFVar6->prev = (FT_ListNode)0x0;
          pFVar6->next = pFVar1;
          pFVar1->prev = pFVar6;
          (library->renderers).head = pFVar6;
        }
        if (renderer->glyph_format == FT_GLYPH_FORMAT_OUTLINE) {
          library->cur_renderer = renderer;
        }
        FVar5 = 0;
        if (num_params != 0) {
          p_Var4 = renderer->clazz->set_mode;
          do {
            FVar5 = (*p_Var4)(renderer,parameters->tag,parameters->data);
            if (FVar5 != 0) {
              return FVar5;
            }
            parameters = parameters + 1;
            num_params = num_params - 1;
            FVar5 = 0;
          } while (num_params != 0);
        }
      }
    }
  }
  return FVar5;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Renderer( FT_Library     library,
                   FT_Renderer    renderer,
                   FT_UInt        num_params,
                   FT_Parameter*  parameters )
  {
    FT_ListNode  node;
    FT_Error     error = FT_Err_Ok;

    FT_Renderer_SetModeFunc  set_mode;


    if ( !library )
    {
      error = FT_THROW( Invalid_Library_Handle );
      goto Exit;
    }

    if ( !renderer )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( num_params > 0 && !parameters )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    node = FT_List_Find( &library->renderers, renderer );
    if ( !node )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_List_Up( &library->renderers, node );

    if ( renderer->glyph_format == FT_GLYPH_FORMAT_OUTLINE )
      library->cur_renderer = renderer;

    set_mode = renderer->clazz->set_mode;

    for ( ; num_params > 0; num_params-- )
    {
      error = set_mode( renderer, parameters->tag, parameters->data );
      if ( error )
        break;
      parameters++;
    }

  Exit:
    return error;
  }